

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt_uint32 stbtt__find_table(stbtt_uint8 *data,stbtt_uint32 fontstart,char *tag)

{
  stbtt_uint16 sVar1;
  uint uVar2;
  stbtt_uint32 sVar3;
  char *in_RDX;
  uint in_ESI;
  long in_RDI;
  stbtt_uint32 loc;
  stbtt_int32 i;
  stbtt_uint32 tabledir;
  stbtt_int32 num_tables;
  int local_2c;
  
  sVar1 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)in_ESI + 4));
  local_2c = 0;
  while( true ) {
    if ((int)(uint)sVar1 <= local_2c) {
      return 0;
    }
    uVar2 = in_ESI + 0xc + local_2c * 0x10;
    if (((((uint)*(byte *)(in_RDI + (ulong)uVar2) == (int)*in_RDX) &&
         ((uint)*(byte *)(in_RDI + 1 + (ulong)uVar2) == (int)in_RDX[1])) &&
        ((uint)*(byte *)(in_RDI + 2 + (ulong)uVar2) == (int)in_RDX[2])) &&
       ((uint)*(byte *)(in_RDI + 3 + (ulong)uVar2) == (int)in_RDX[3])) break;
    local_2c = local_2c + 1;
  }
  sVar3 = ttULONG((stbtt_uint8 *)(in_RDI + (ulong)uVar2 + 8));
  return sVar3;
}

Assistant:

static stbtt_uint32 stbtt__find_table(stbtt_uint8 *data, stbtt_uint32 fontstart, const char *tag)
{
   stbtt_int32 num_tables = ttUSHORT(data+fontstart+4);
   stbtt_uint32 tabledir = fontstart + 12;
   stbtt_int32 i;
   for (i=0; i < num_tables; ++i) {
      stbtt_uint32 loc = tabledir + 16*i;
      if (stbtt_tag(data+loc+0, tag))
         return ttULONG(data+loc+8);
   }
   return 0;
}